

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

vec3f * __thiscall Model::normal(vec3f *__return_storage_ptr__,Model *this,vec2f *uvf)

{
  byte bVar1;
  TGAColor TVar2;
  TGAImage *this_00;
  size_t sVar3;
  ulong uVar4;
  byte *pbVar5;
  double *pdVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ulong local_28;
  size_t i;
  vec2f *pvStack_18;
  TGAColor c;
  vec2f *uvf_local;
  Model *this_local;
  
  this_00 = &this->normalmap_;
  pvStack_18 = uvf;
  dVar8 = vec<2UL,_double>::operator[](uvf,0);
  sVar3 = TGAImage::get_width(this_00);
  auVar10._8_4_ = (int)(sVar3 >> 0x20);
  auVar10._0_8_ = sVar3;
  auVar10._12_4_ = 0x45300000;
  dVar8 = dVar8 * ((auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0));
  uVar4 = (ulong)dVar8;
  dVar9 = vec<2UL,_double>::operator[](pvStack_18,1);
  sVar3 = TGAImage::get_height(this_00);
  auVar11._8_4_ = (int)(sVar3 >> 0x20);
  auVar11._0_8_ = sVar3;
  auVar11._12_4_ = 0x45300000;
  dVar9 = dVar9 * ((auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0));
  uVar7 = (ulong)dVar9;
  TVar2 = TGAImage::get(this_00,uVar4 | (long)(dVar8 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f,
                        uVar7 | (long)(dVar9 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f);
  i._3_4_ = TVar2.bgra;
  i._7_1_ = TVar2.bytespp;
  vec<3UL,_double>::vec(__return_storage_ptr__);
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    pbVar5 = TGAColor::operator[]((TGAColor *)((long)&i + 3),local_28);
    bVar1 = *pbVar5;
    pdVar6 = vec<3UL,_double>::operator[](__return_storage_ptr__,2 - local_28);
    *pdVar6 = (double)bVar1 / 255.0 + (double)bVar1 / 255.0 + -1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

vec3f Model::normal(const vec2f &uvf) const
{
    TGAColor c = normalmap_.get(static_cast<size_t>(uvf[0] * normalmap_.get_width()),
                                static_cast<size_t>(uvf[1] * normalmap_.get_height()));
    vec3f res;
    for (size_t i = 0; i < 3; i++) res[2 - i] = c[i] / 255. * 2 - 1;
    return res;
}